

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

char * ucnv_io_stripEBCDICForCompare_63(char *dst,char *name)

{
  bool bVar1;
  char *pcVar2;
  uint8_t local_2d;
  uint8_t local_25;
  uint8_t local_23;
  UBool afterDigit;
  char c1;
  uint8_t nextType;
  uint8_t *puStack_20;
  uint8_t type;
  char *dstItr;
  char *name_local;
  char *dst_local;
  
  bVar1 = false;
  puStack_20 = (uint8_t *)dst;
  dstItr = name;
  while( true ) {
    while( true ) {
      pcVar2 = dstItr + 1;
      local_23 = *dstItr;
      if (local_23 == '\0') {
        *puStack_20 = '\0';
        return dst;
      }
      if ((char)local_23 < '\0') {
        local_25 = ""[(int)((int)(char)local_23 & 0x7f)];
      }
      else {
        local_25 = '\0';
      }
      dstItr = pcVar2;
      if (local_25 != '\0') break;
      bVar1 = false;
    }
    if (local_25 != '\x01') break;
    if (bVar1) goto LAB_00381824;
    if (*pcVar2 < '\0') {
      local_2d = ""[(int)((int)*pcVar2 & 0x7f)];
    }
    else {
      local_2d = '\0';
    }
    if ((local_2d != '\x01') && (local_2d != '\x02')) {
LAB_00381824:
      *puStack_20 = local_23;
      puStack_20 = puStack_20 + 1;
    }
  }
  if (local_25 == '\x02') {
    bVar1 = true;
  }
  else {
    local_23 = local_25;
    bVar1 = false;
  }
  goto LAB_00381824;
}

Assistant:

U_CAPI char * U_CALLCONV
ucnv_io_stripEBCDICForCompare(char *dst, const char *name) {
    char *dstItr = dst;
    uint8_t type, nextType;
    char c1;
    UBool afterDigit = FALSE;

    while ((c1 = *name++) != 0) {
        type = GET_EBCDIC_TYPE(c1);
        switch (type) {
        case UIGNORE:
            afterDigit = FALSE;
            continue; /* ignore all but letters and digits */
        case ZERO:
            if (!afterDigit) {
                nextType = GET_EBCDIC_TYPE(*name);
                if (nextType == ZERO || nextType == NONZERO) {
                    continue; /* ignore leading zero before another digit */
                }
            }
            break;
        case NONZERO:
            afterDigit = TRUE;
            break;
        default:
            c1 = (char)type; /* lowercased letter */
            afterDigit = FALSE;
            break;
        }
        *dstItr++ = c1;
    }
    *dstItr = 0;
    return dst;
}